

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist.cpp
# Opt level: O1

bool __thiscall curl::Slist::append(Slist *this,string *str)

{
  curl_slist *pcVar1;
  
  pcVar1 = (curl_slist *)curl_slist_append(this->m_slist,*(undefined8 *)str);
  if (pcVar1 != (curl_slist *)0x0) {
    this->m_slist = pcVar1;
  }
  return pcVar1 != (curl_slist *)0x0;
}

Assistant:

bool Slist::append(const std::string& str) {
    return append(str.c_str());
}